

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall
helics::apps::Player::loadJsonFile
          (Player *this,string *jsonString,bool enableFederateInterfaceRegistration)

{
  char cVar1;
  _Map_pointer ppPVar2;
  _Map_pointer ppPVar3;
  _Elt_pointer pPVar4;
  _Elt_pointer pPVar5;
  _Map_pointer ppEVar6;
  _Map_pointer ppEVar7;
  _Elt_pointer pEVar8;
  _Elt_pointer pEVar9;
  pointer pVVar10;
  string_view str;
  string_view str_00;
  pointer pcVar11;
  bool bVar12;
  int iVar13;
  Publication *pPVar14;
  string *psVar15;
  mapped_type *pmVar16;
  Endpoint *pEVar17;
  const_iterator cVar18;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar19;
  reference pvVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  const_reference pvVar22;
  pointer pcVar23;
  Time TVar24;
  int *piVar25;
  undefined8 uVar26;
  _Uninitialized<double,_true> _Var27;
  Time TVar28;
  byte bVar29;
  ulong uVar30;
  size_t in_R8;
  pointer pMVar31;
  int iVar32;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar33;
  size_type __n;
  _Alloc_hider _Var34;
  string_view encoded_string;
  string_view encoded_string_00;
  string type;
  defV val;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_2;
  iterator __begin3;
  iterator __end3;
  string dest;
  json doc;
  string type_1;
  char *in_stack_fffffffffffffe18;
  long local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [40];
  __index_type local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  data local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *local_98;
  undefined1 local_90 [32];
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  local_1b8._0_8_ = (long)local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"player","");
  apps::App::loadJsonFileConfiguration
            (&this->super_App,(string *)local_1b8,jsonString,enableFederateInterfaceRegistration);
  if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
  }
  iVar13 = helics::ValueFederate::getPublicationCount
                     (&((this->super_App).fed.
                        super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_ValueFederate);
  if (0 < iVar13) {
    iVar32 = 0;
    do {
      pPVar14 = helics::ValueFederate::getPublication
                          (&((this->super_App).fed.
                             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_ValueFederate,iVar32);
      std::deque<helics::Publication,std::allocator<helics::Publication>>::
      emplace_back<helics::Publication&>
                ((deque<helics::Publication,std::allocator<helics::Publication>> *)
                 &this->publications,pPVar14);
      ppPVar2 = (this->publications).
                super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl
                .super__Deque_impl_data._M_finish._M_node;
      ppPVar3 = (this->publications).
                super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl
                .super__Deque_impl_data._M_start._M_node;
      pPVar14 = (this->publications).
                super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl
                .super__Deque_impl_data._M_finish._M_cur;
      uVar30 = (long)pPVar14 -
               (long)(this->publications).
                     super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_first;
      if (uVar30 == 0) {
        pPVar14 = ppPVar2[-1] + 2;
      }
      pPVar4 = (this->publications).
               super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      pPVar5 = (this->publications).
               super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      psVar15 = Interface::getName_abi_cxx11_(&pPVar14[-1].super_Interface);
      local_1b8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_1b8._0_8_ = psVar15->_M_string_length;
      pmVar16 = CLI::std::__detail::
                _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->pubids,(key_type *)local_1b8);
      *pmVar16 = (int)((ulong)((long)pPVar4 - (long)pPVar5) >> 3) * -0x3d70a3d7 +
                 (int)(uVar30 >> 3) * -0x3d70a3d7 +
                 ((int)((ulong)((long)ppPVar2 - (long)ppPVar3) >> 3) + -1 +
                 (uint)(ppPVar2 == (_Map_pointer)0x0)) * 2 + -1;
      iVar32 = iVar32 + 1;
    } while (iVar13 != iVar32);
  }
  iVar13 = helics::MessageFederate::getEndpointCount
                     ((MessageFederate *)
                      &(((this->super_App).fed.
                         super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_ValueFederate).field_0x10);
  if (0 < iVar13) {
    iVar32 = 0;
    do {
      pEVar17 = helics::MessageFederate::getEndpoint
                          ((MessageFederate *)
                           &(((this->super_App).fed.
                              super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ValueFederate).field_0x10,iVar32);
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,
                 pEVar17);
      ppEVar6 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      ppEVar7 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      pEVar17 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      uVar30 = (long)pEVar17 -
               (long)(this->endpoints).
                     super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first;
      if (uVar30 == 0) {
        pEVar17 = ppEVar6[-1] + 4;
      }
      pEVar8 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      pEVar9 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      psVar15 = Interface::getName_abi_cxx11_(&pEVar17[-1].super_Interface);
      local_1b8._8_8_ = (psVar15->_M_dataplus)._M_p;
      local_1b8._0_8_ = psVar15->_M_string_length;
      pmVar16 = CLI::std::__detail::
                _Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->eptids,(key_type *)local_1b8);
      *pmVar16 = (int)((ulong)((long)pEVar8 - (long)pEVar9) >> 3) * -0x11111111 +
                 (int)(uVar30 >> 3) * -0x11111111 +
                 ((int)((ulong)((long)ppEVar6 - (long)ppEVar7) >> 3) + -1 +
                 (uint)(ppEVar6 == (_Map_pointer)0x0)) * 4 + -1;
      iVar32 = iVar32 + 1;
    } while (iVar13 != iVar32);
  }
  fileops::loadJson((fileops *)(local_d8 + 0x10),(string *)jsonString);
  if ((((local_c8.m_type == '\x01') &&
       (cVar18 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                 ::_M_find_tr<char[7],void>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                             *)local_c8.m_value.object,(char (*) [7])"player"),
       cVar18._M_node != (_Base_ptr)((long)local_c8.m_value.object + 8))) &&
      (pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)(local_d8 + 0x10),"player"),
      *pbVar19 ==
      (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
       )0x1)) &&
     (cVar18 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               ::_M_find_tr<char[11],void>
                         (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                            **)(pbVar19 + 8),(char (*) [11])0x40a69a),
     cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
    pvVar20 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(pbVar19,"time_units");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_1b8,pvVar20);
    iVar13 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     "ns");
    if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    if (iVar13 == 0) {
      this->timeMultiplier = 1e-09;
    }
  }
  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)(local_d8 + 0x10),"points");
  if (paVar21->_M_local_buf[0] == '\x02') {
    local_98 = &this->points;
    CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::reserve
              (local_98,((long)(((json_value *)((long)paVar21 + 8))->array->
                               super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(((json_value *)((long)paVar21 + 8))->array->
                               super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 4) +
                        ((long)(this->points).
                               super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->points).
                               super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 7));
    local_128.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_128.m_it.array_iterator._M_current = (pointer)0x0;
    local_128.m_it.primitive_iterator.m_it = -0x8000000000000000;
    cVar1 = paVar21->_M_local_buf[0];
    if (cVar1 == '\0') {
      local_128.m_it.primitive_iterator.m_it = 1;
    }
    else if (cVar1 == '\x02') {
      local_128.m_it.array_iterator._M_current =
           (((json_value *)((long)paVar21 + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    }
    else if (cVar1 == '\x01') {
      local_128.m_it.object_iterator._M_node =
           (_Base_ptr)((json_value *)((long)paVar21 + 8))->binary->m_subtype;
    }
    else {
      local_128.m_it.primitive_iterator.m_it = 0;
    }
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_108.field_2._8_8_ = 0x8000000000000000;
    local_128.m_object = (pointer)paVar21;
    local_108._M_dataplus._M_p = (pointer)paVar21;
    if (paVar21->_M_local_buf[0] == '\x02') {
      local_108.field_2._M_allocated_capacity =
           (size_type)
           (((json_value *)((long)paVar21 + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (paVar21->_M_local_buf[0] == '\x01') {
      local_108._M_string_length =
           (size_type)
           &(((json_value *)((long)paVar21 + 8))->object->_M_t)._M_impl.super__Rb_tree_header;
    }
    else {
      local_108.field_2._8_8_ = 1;
    }
    while( true ) {
      bVar12 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::
               operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                         (&local_128,
                          (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)&local_108);
      if (bVar12) break;
      pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*(&local_128);
      if (*pbVar19 ==
          (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           )0x1) {
        cVar18 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                 ::_M_find_tr<char[5],void>
                           (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                              **)(pbVar19 + 8),(char (*) [5])0x41f321);
        if (cVar18._M_node ==
            (_Base_ptr)
            (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               **)(pbVar19 + 8) + 8)) {
          if ((*pbVar19 !=
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) ||
             (cVar18 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[2],void>
                                 (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                    **)(pbVar19 + 8),(char (*) [2])0x419206),
             cVar18._M_node == (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) goto LAB_001c0049;
          pvVar22 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar19,"t");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_1b8,pvVar22);
          if ((_Rb_tree_node_base *)local_1b8._8_8_ == (_Rb_tree_node_base *)0x0) {
LAB_001c0327:
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_1d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8);
            TVar24 = fileops::loadJsonTime((json *)&local_1d8,this->units);
            goto LAB_001c01d1;
          }
          pcVar11 = (pointer)(local_1b8._8_8_ - 1);
          do {
            pcVar23 = pcVar11;
            if (pcVar23 == (pointer)0xffffffffffffffff) goto LAB_001c0327;
            pcVar11 = pcVar23 + -1;
          } while (pcVar23[local_1b8._0_8_] != ':');
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,0,
                 (size_type)(pcVar23 + -1));
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_168,&local_1d8);
          TVar24 = fileops::loadJsonTime((json *)&local_168,this->units);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,
                            CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                     local_1d8.field_2._M_local_buf[0]) + 1);
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 (size_type)(pcVar23 + 1),0xffffffffffffffff);
          _Var34._M_p = local_1d8._M_dataplus._M_p;
          piVar25 = __errno_location();
          iVar13 = *piVar25;
          *piVar25 = 0;
          local_1e0 = strtol(_Var34._M_p,(char **)&local_168,10);
          if (local_168._M_dataplus._M_p == _Var34._M_p) {
            uVar26 = std::__throw_invalid_argument("stoi");
            goto LAB_001c1016;
          }
          if ((local_1e0 - 0x80000000U < 0xffffffff00000000) || (iVar32 = *piVar25, iVar32 == 0x22))
          {
            uVar26 = std::__throw_out_of_range("stoi");
            goto LAB_001c1016;
          }
LAB_001c0186:
          if (iVar32 == 0) {
            *piVar25 = iVar13;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,
                            CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                     local_1d8.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          pvVar22 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar19,"time");
          if ((byte)((pvVar22->m_data).m_type - number_integer) < 3) {
            local_1d8._M_dataplus._M_p = (pointer)0x0;
            nlohmann::json_abi_v3_11_3::detail::
            get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                      (pvVar22,(double *)&local_1d8);
            __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,vsnprintf,0x148,"%f",(int)local_1d8._M_dataplus._M_p);
          }
          else {
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_1b8,pvVar22);
          }
          if ((_Rb_tree_node_base *)local_1b8._8_8_ != (_Rb_tree_node_base *)0x0) {
            pcVar11 = (pointer)(local_1b8._8_8_ - 1);
            do {
              pcVar23 = pcVar11;
              if (pcVar23 == (pointer)0xffffffffffffffff) goto LAB_001c01ac;
              pcVar11 = pcVar23 + -1;
            } while (pcVar23[local_1b8._0_8_] != ':');
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,0,
                   (size_type)(pcVar23 + -1));
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_168,&local_1d8);
            TVar24 = fileops::loadJsonTime((json *)&local_168,this->units);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data((data *)&local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,
                              CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                       local_1d8.field_2._M_local_buf[0]) + 1);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr(&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   (size_type)(pcVar23 + 1),0xffffffffffffffff);
            _Var34._M_p = local_1d8._M_dataplus._M_p;
            piVar25 = __errno_location();
            iVar13 = *piVar25;
            *piVar25 = 0;
            local_1e0 = strtol(_Var34._M_p,(char **)&local_168,10);
            if (local_168._M_dataplus._M_p == _Var34._M_p) {
              uVar26 = std::__throw_invalid_argument("stoi");
LAB_001c1016:
              if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
                operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
              }
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::data::~data((data *)(local_d8 + 0x10));
              _Unwind_Resume(uVar26);
            }
            if ((local_1e0 - 0x80000000U < 0xffffffff00000000) ||
               (iVar32 = *piVar25, iVar32 == 0x22)) {
              uVar26 = std::__throw_out_of_range("stoi");
              goto LAB_001c1016;
            }
            goto LAB_001c0186;
          }
LAB_001c01ac:
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
          ;
          TVar24 = fileops::loadJsonTime((json *)&local_1d8,this->units);
LAB_001c01d1:
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_1d8);
          local_1e0._0_4_ = 0;
        }
        paVar21 = &local_168.field_2;
        paVar33 = &local_1d8.field_2;
        if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
        }
        local_1b8._0_8_ = 0.0;
        local_190 = '\0';
        if (*pbVar19 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          cVar18 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[6],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar19 + 8),(char (*) [6])0x42f4d9);
          if (cVar18._M_node ==
              (_Base_ptr)
              (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                 **)(pbVar19 + 8) + 8)) {
            if ((*pbVar19 ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) &&
               (cVar18 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[2],void>
                                   (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                      **)(pbVar19 + 8),(char (*) [2])0x4201ed),
               cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
              pvVar22 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>(pbVar19,"v");
              bVar29 = (pvVar22->m_data).m_type - number_integer;
              if (1 < bVar29) {
                if (bVar29 != 2) {
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            (&local_1d8,pvVar22);
                  goto LAB_001c0361;
                }
                local_1d8._M_dataplus._M_p = (pointer)0x0;
                nlohmann::json_abi_v3_11_3::detail::
                get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                          (pvVar22,(double *)&local_1d8);
                goto LAB_001c0304;
              }
              local_1d8._M_dataplus._M_p = (pointer)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_long,_0>
                        (pvVar22,(long *)&local_1d8);
              goto LAB_001c0269;
            }
          }
          else {
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"value");
            bVar29 = (pvVar22->m_data).m_type - number_integer;
            if (bVar29 < 2) {
              local_1d8._M_dataplus._M_p = (pointer)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_long,_0>
                        (pvVar22,(long *)&local_1d8);
LAB_001c0269:
              local_168._M_dataplus._M_p = local_1d8._M_dataplus._M_p;
              std::
              variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                           *)local_1b8,(long *)&local_168);
            }
            else if (bVar29 == 2) {
              local_1d8._M_dataplus._M_p = (pointer)0x0;
              nlohmann::json_abi_v3_11_3::detail::
              get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                        (pvVar22,(double *)&local_1d8);
LAB_001c0304:
              local_168._M_dataplus._M_p = local_1d8._M_dataplus._M_p;
              std::
              variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                           *)local_1b8,(double *)&local_168);
            }
            else {
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_1d8,pvVar22);
LAB_001c0361:
              std::
              variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
              ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                           *)local_1b8,&local_1d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != paVar33) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                         local_1d8.field_2._M_local_buf[0]) + 1);
              }
            }
          }
        }
        local_1d8._M_string_length = 0;
        local_1d8.field_2._M_local_buf[0] = '\0';
        local_1d8._M_dataplus._M_p = (pointer)paVar33;
        if (*pbVar19 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          cVar18 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[5],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar19 + 8),(char (*) [5])0x41a72b);
          if (cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8)) {
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"type");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_50,pvVar22);
            loadJsonFile();
          }
          if ((*pbVar19 ==
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) &&
             (cVar18 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[10],void>
                                 (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                    **)(pbVar19 + 8),(char (*) [10])0x428528),
             cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"iteration");
            local_168._M_dataplus._M_p = local_168._M_dataplus._M_p & 0xffffffff00000000;
            nlohmann::json_abi_v3_11_3::detail::
            from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_int,_0>
                      (pvVar22,(int *)&local_168);
            local_1e0._0_4_ = (int)local_168._M_dataplus._M_p;
          }
        }
        local_168._M_string_length = 0;
        local_168.field_2._M_local_buf[0] = '\0';
        local_168._M_dataplus._M_p = (pointer)paVar21;
        if ((*pbVar19 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (cVar18 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                     ::_M_find_tr<char[4],void>
                               (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                  **)(pbVar19 + 8),(char (*) [4])0x42ca82),
           cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
          pvVar22 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar19,"key");
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_e8,pvVar22);
          loadJsonFile();
          CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::
          resize(local_98,((long)(this->points).
                                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->points).
                                 super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 7) + 1);
          pVVar10 = (this->points).
                    super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pVVar10[-1].time.internalTimeCode = TVar24.internalTimeCode;
          pVVar10[-1].iteration = (int)local_1e0;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign(&pVVar10[-1].pubName,&local_168);
          local_e8._0_8_ =
               &(this->points).
                super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].value;
          (*CLI::std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
            ::_S_vtable._M_arr[(long)(char)local_190 + 1]._M_data)
                    ((anon_class_8_1_8991fb9c *)local_e8,
                     (variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                      *)local_1b8);
          if (local_1d8._M_string_length != 0) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_assign(&(this->points).
                       super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].type,&local_1d8);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"key not specified\n",0x12);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar21) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != paVar33) {
          operator_delete(local_1d8._M_dataplus._M_p,
                          CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,
                                   local_1d8.field_2._M_local_buf[0]) + 1);
        }
        CLI::std::__detail::__variant::
        _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                             *)local_1b8);
      }
      else {
LAB_001c0049:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"time not specified\n",0x13);
      }
      if (*(char *)local_128.m_object == '\x02') {
        local_128.m_it.array_iterator._M_current = local_128.m_it.array_iterator._M_current + 1;
      }
      else if (*(char *)local_128.m_object == '\x01') {
        local_128.m_it.object_iterator._M_node =
             (_Base_ptr)std::_Rb_tree_increment(local_128.m_it.object_iterator._M_node);
      }
      else {
        local_128.m_it.primitive_iterator.m_it = local_128.m_it.primitive_iterator.m_it + 1;
      }
    }
  }
  _Var27._M_storage =
       (double)nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)(local_d8 + 0x10),"messages");
  if (*(char *)_Var27._M_storage == '\x02') {
    CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
    reserve(&this->messages,
            ((long)(((json_value *)((long)_Var27._M_storage + 8))->array->
                   super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(((json_value *)((long)_Var27._M_storage + 8))->array->
                   super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4) +
            ((long)(this->messages).
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->messages).
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f);
    local_1b8._8_8_ = (_Rb_tree_node_base *)0x0;
    local_1b8._16_8_ = (pointer)0x0;
    local_1b8._24_8_ = -0x8000000000000000;
    cVar1 = *(char *)_Var27._M_storage;
    if (cVar1 == '\0') {
      local_1b8._24_8_ = 1;
    }
    else if (cVar1 == '\x02') {
      local_1b8._16_8_ =
           (((json_value *)((long)_Var27._M_storage + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    }
    else if (cVar1 == '\x01') {
      local_1b8._8_8_ = ((json_value *)((long)_Var27._M_storage + 8))->binary->m_subtype;
    }
    else {
      local_1b8._24_8_ = 0;
    }
    local_128.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_128.m_it.array_iterator._M_current = (pointer)0x0;
    local_128.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (*(char *)_Var27._M_storage == '\x02') {
      local_128.m_it.array_iterator._M_current =
           (((json_value *)((long)_Var27._M_storage + 8))->array->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else if (*(char *)_Var27._M_storage == '\x01') {
      local_128.m_it.object_iterator._M_node =
           &(((json_value *)((long)_Var27._M_storage + 8))->object->_M_t)._M_impl.
            super__Rb_tree_header._M_header;
    }
    else {
      local_128.m_it.primitive_iterator.m_it = 1;
    }
    paVar21 = &local_108.field_2;
    local_1b8._0_8_ = _Var27._M_storage;
    local_128.m_object = (pointer)_Var27._M_storage;
    while( true ) {
      bVar12 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::
               operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                         ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)local_1b8,&local_128);
      if (bVar12) break;
      pbVar19 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 *)nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)local_1b8);
      if (*pbVar19 ==
          (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           )0x1) {
        cVar18 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                 ::_M_find_tr<char[5],void>
                           (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                              **)(pbVar19 + 8),(char (*) [5])0x41f321);
        if (cVar18._M_node ==
            (_Base_ptr)
            (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
               **)(pbVar19 + 8) + 8)) {
          if ((*pbVar19 !=
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) ||
             (cVar18 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[2],void>
                                 (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                    **)(pbVar19 + 8),(char (*) [2])0x419206),
             cVar18._M_node == (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) goto LAB_001c0c41;
          pvVar22 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar19,"t");
          TVar24 = fileops::loadJsonTime(pvVar22,this->units);
        }
        else {
          pvVar22 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar19,"time");
          TVar24 = fileops::loadJsonTime(pvVar22,this->units);
        }
        local_108._M_string_length = 0;
        local_108.field_2._M_allocated_capacity =
             local_108.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_108._M_dataplus._M_p = (pointer)paVar21;
        if (*pbVar19 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          cVar18 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[4],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar19 + 8),(char (*) [4])"src");
          if (cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8)) {
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"src");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_1d8,pvVar22);
            loadJsonFile();
          }
          if ((*pbVar19 ==
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) &&
             (cVar18 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[7],void>
                                 (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                    **)(pbVar19 + 8),(char (*) [7])0x42484a),
             cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"source");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_168,pvVar22);
            loadJsonFile();
          }
        }
        local_e8._8_8_ = 0;
        local_d8[0] = 0;
        local_e8._0_8_ = (defV *)local_d8;
        if (*pbVar19 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          cVar18 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[5],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar19 + 8),(char (*) [5])0x416fda);
          if (cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8)) {
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"dest");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_70,pvVar22);
            loadJsonFile();
          }
          if ((*pbVar19 ==
               (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                )0x1) &&
             (cVar18 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                       ::_M_find_tr<char[12],void>
                                 (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                    **)(pbVar19 + 8),(char (*) [12])0x416fca),
             cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"destination");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (local_90,pvVar22);
            loadJsonFile();
          }
        }
        local_b8 = &local_a8;
        local_b0._0_1_ = '\0';
        local_b0._1_7_ = 0;
        local_a8 = 0;
        TVar28.internalTimeCode = TVar24.internalTimeCode;
        if ((*pbVar19 ==
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x1) &&
           (cVar18 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                     ::_M_find_tr<char[9],void>
                               (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                  **)(pbVar19 + 8),(char (*) [9])"sendtime"),
           cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
          pvVar22 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(pbVar19,"sendtime");
          TVar28 = fileops::loadJsonTime(pvVar22,this->units);
        }
        CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
        ::resize(&this->messages,
                 ((long)(this->messages).
                        super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->messages).
                        super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf0f0f0f0f0f0f0f + 1);
        pMVar31 = (this->messages).
                  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pMVar31[-1].sendTime.internalTimeCode = TVar24.internalTimeCode;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&pMVar31[-1].mess.source,&local_108);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&(this->messages).
                   super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].mess.dest,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
        (this->messages).
        super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].mess.time.internalTimeCode =
             TVar28.internalTimeCode;
        if (*pbVar19 ==
            (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             )0x1) {
          cVar18 = std::
                   _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                   ::_M_find_tr<char[5],void>
                             (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                **)(pbVar19 + 8),(char (*) [5])0x41e544);
          if (cVar18._M_node ==
              (_Base_ptr)
              (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                 **)(pbVar19 + 8) + 8)) {
            if ((*pbVar19 !=
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) ||
               (cVar18 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[8],void>
                                   (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                      **)(pbVar19 + 8),(char (*) [8])0x4251c7),
               cVar18._M_node == (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) goto LAB_001c0f4d;
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"message");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_148,pvVar22);
            if ((*pbVar19 ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) &&
               (cVar18 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[9],void>
                                   (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                      **)(pbVar19 + 8),(char (*) [9])"encoding"),
               cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
              pvVar22 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>(pbVar19,"encoding");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_188,pvVar22);
              iVar13 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (&local_188,"base64");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((iVar13 == 0) &&
                 (str_00._M_str = in_stack_fffffffffffffe18, str_00._M_len = 0x1c0d34,
                 iVar13 = hasB64Wrapper(str_00), iVar13 == 0)) {
                encoded_string_00._M_str = (char *)0x0;
                encoded_string_00._M_len = (size_t)local_148._M_dataplus._M_p;
                gmlc::utilities::base64_decode_to_string_abi_cxx11_
                          ((string *)&local_188,(utilities *)local_148._M_string_length,
                           encoded_string_00,in_R8);
                __n = local_188._M_string_length;
                _Var34._M_p = local_188._M_dataplus._M_p;
                pMVar31 = (this->messages).
                          super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if ((byte *)local_188._M_dataplus._M_p == pMVar31[-1].mess.data.heap)
                goto LAB_001c0f05;
                SmallBuffer::reserve(&pMVar31[-1].mess.data,local_188._M_string_length);
                goto LAB_001c0bd8;
              }
            }
            decode(&local_188,&local_148);
            __n = local_188._M_string_length;
            _Var34._M_p = local_188._M_dataplus._M_p;
            pMVar31 = (this->messages).
                      super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if ((byte *)local_188._M_dataplus._M_p != pMVar31[-1].mess.data.heap) {
              SmallBuffer::reserve(&pMVar31[-1].mess.data,local_188._M_string_length);
              goto LAB_001c0bd8;
            }
LAB_001c0f05:
            pMVar31[-1].mess.data.bufferSize = local_188._M_string_length;
          }
          else {
            pvVar22 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(pbVar19,"data");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_148,pvVar22);
            if ((*pbVar19 ==
                 (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  )0x1) &&
               (cVar18 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                         ::_M_find_tr<char[9],void>
                                   (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>
                                      **)(pbVar19 + 8),(char (*) [9])"encoding"),
               cVar18._M_node != (_Base_ptr)(*(long *)(pbVar19 + 8) + 8))) {
              pvVar22 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::operator[]<char_const>(pbVar19,"encoding");
              nlohmann::json_abi_v3_11_3::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              ::
              get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_188,pvVar22);
              iVar13 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (&local_188,"base64");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((iVar13 != 0) ||
                 (str._M_str = in_stack_fffffffffffffe18, str._M_len = 0x1c0b93,
                 iVar13 = hasB64Wrapper(str), iVar13 != 0)) goto LAB_001c0b9b;
              encoded_string._M_str = (char *)0x0;
              encoded_string._M_len = (size_t)local_148._M_dataplus._M_p;
              gmlc::utilities::base64_decode_to_string_abi_cxx11_
                        ((string *)&local_188,(utilities *)local_148._M_string_length,encoded_string
                         ,in_R8);
              __n = local_188._M_string_length;
              _Var34._M_p = local_188._M_dataplus._M_p;
              pMVar31 = (this->messages).
                        super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((byte *)local_188._M_dataplus._M_p == pMVar31[-1].mess.data.heap)
              goto LAB_001c0f05;
              SmallBuffer::reserve(&pMVar31[-1].mess.data,local_188._M_string_length);
            }
            else {
LAB_001c0b9b:
              decode(&local_188,&local_148);
              __n = local_188._M_string_length;
              _Var34._M_p = local_188._M_dataplus._M_p;
              pMVar31 = (this->messages).
                        super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              if ((byte *)local_188._M_dataplus._M_p == pMVar31[-1].mess.data.heap)
              goto LAB_001c0f05;
              SmallBuffer::reserve(&pMVar31[-1].mess.data,local_188._M_string_length);
            }
LAB_001c0bd8:
            pMVar31[-1].mess.data.bufferSize = __n;
            if (__n != 0) {
              memcpy(pMVar31[-1].mess.data.heap,_Var34._M_p,__n);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != &local_188.field_2) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
        }
LAB_001c0f4d:
        if ((undefined1 *)local_b8 != &local_a8) {
          operator_delete((void *)local_b8,CONCAT71(uStack_a7,local_a8) + 1);
        }
        if ((_Move_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             *)local_e8._0_8_ !=
            (_Move_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             *)local_d8) {
          operator_delete((void *)local_e8._0_8_,CONCAT71(local_d8._1_7_,local_d8[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != paVar21) {
          operator_delete(local_108._M_dataplus._M_p,
                          (ulong)(local_108.field_2._M_allocated_capacity + 1));
        }
      }
      else {
LAB_001c0c41:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"time not specified\n",0x13);
      }
      if (*(char *)local_1b8._0_8_ == '\x02') {
        local_1b8._16_8_ = local_1b8._16_8_ + 0x10;
      }
      else if (*(char *)local_1b8._0_8_ == '\x01') {
        local_1b8._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_1b8._8_8_);
      }
      else {
        local_1b8._24_8_ = local_1b8._24_8_ + 1;
      }
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)(local_d8 + 0x10));
  return;
}

Assistant:

void Player::loadJsonFile(const std::string& jsonString, bool enableFederateInterfaceRegistration)
{
    loadJsonFileConfiguration("player", jsonString, enableFederateInterfaceRegistration);

    auto pubCount = fed->getPublicationCount();
    for (int ii = 0; ii < pubCount; ++ii) {
        publications.emplace_back(fed->getPublication(ii));
        pubids[publications.back().getName()] = static_cast<int>(publications.size() - 1);
    }
    auto eptCount = fed->getEndpointCount();
    for (int ii = 0; ii < eptCount; ++ii) {
        endpoints.emplace_back(fed->getEndpoint(ii));
        eptids[endpoints.back().getName()] = static_cast<int>(endpoints.size() - 1);
    }

    auto doc = fileops::loadJson(jsonString);

    if (doc.contains("player")) {
        auto& playerConfig = doc["player"];
        if (playerConfig.contains("time_units")) {
            if (playerConfig["time_units"].get<std::string>() == "ns") {
                timeMultiplier = 1e-9;
            }
        }
    }
    auto& pointArray = doc["points"];
    if (pointArray.is_array()) {
        points.reserve(points.size() + pointArray.size());
        for (const auto& pointElement : pointArray) {
            Time ptime;
            int iterationIndex = 0;
            if (pointElement.contains("time")) {
                const auto& telement = pointElement["time"];
                auto str = telement.is_number() ? std::to_string(telement.get<double>()) :
                                                  telement.get<std::string>();
                auto cloc = str.find_last_of(':');
                if (cloc == std::string::npos) {
                    ptime = fileops::loadJsonTime(str, units);
                } else {
                    ptime = fileops::loadJsonTime(str.substr(0, cloc - 1), units);
                    try {
                        iterationIndex = std::stoi(str.substr(cloc + 1));
                    }
                    catch (const std::exception&) {
                        iterationIndex = 0;
                    }
                }
            } else if (pointElement.contains("t")) {
                auto str = pointElement["t"].get<std::string>();
                auto cloc = str.find_last_of(':');
                if (cloc == std::string::npos) {
                    ptime = fileops::loadJsonTime(str, units);
                } else {
                    ptime = fileops::loadJsonTime(str.substr(0, cloc - 1), units);
                    try {
                        iterationIndex = std::stoi(str.substr(cloc + 1));
                    }
                    catch (const std::exception&) {
                        iterationIndex = 0;
                    }
                }
            } else {
                std::cout << "time not specified\n";
                continue;
            }
            defV val;
            if (pointElement.contains("value")) {
                auto& M = pointElement["value"];
                if (M.is_number_integer()) {
                    val = M.get<int64_t>();
                } else if (M.is_number()) {
                    val = M.get<double>();
                } else {
                    val = M.get<std::string>();
                }
            } else if (pointElement.contains("v")) {
                auto& M = pointElement["v"];
                if (M.is_number_integer()) {
                    val = M.get<int64_t>();
                } else if (M.is_number()) {
                    val = M.get<double>();
                } else {
                    val = M.get<std::string>();
                }
            }
            std::string type;
            if (pointElement.contains("type")) {
                type = pointElement["type"].get<std::string>();
            }
            if (pointElement.contains("iteration")) {
                iterationIndex = pointElement["iteration"].get<int>();
            }
            std::string key;
            if (pointElement.contains("key")) {
                key = pointElement["key"].get<std::string>();
            } else {
                std::cout << "key not specified\n";
                continue;
            }
            points.resize(points.size() + 1);
            points.back().time = ptime;
            points.back().iteration = iterationIndex;
            points.back().pubName = key;
            points.back().value = std::move(val);
            if (!type.empty()) {
                points.back().type = type;
            }
        }
    }

    auto& messageArray = doc["messages"];
    if (messageArray.is_array()) {
        messages.reserve(messages.size() + messageArray.size());
        for (const auto& messageElement : messageArray) {
            Time ptime;
            if (messageElement.contains("time")) {
                ptime = fileops::loadJsonTime(messageElement["time"], units);
            } else if (messageElement.contains("t")) {
                ptime = fileops::loadJsonTime(messageElement["t"], units);
            } else {
                std::cout << "time not specified\n";
                continue;
            }
            std::string src;
            if (messageElement.contains("src")) {
                src = messageElement["src"].get<std::string>();
            }
            if (messageElement.contains("source")) {
                src = messageElement["source"].get<std::string>();
            }
            std::string dest;
            if (messageElement.contains("dest")) {
                dest = messageElement["dest"].get<std::string>();
            }
            if (messageElement.contains("destination")) {
                dest = messageElement["destination"].get<std::string>();
            }
            Time sendTime = ptime;
            std::string type;
            if (messageElement.contains("sendtime")) {
                ptime = fileops::loadJsonTime(messageElement["sendtime"], units);
            }

            messages.resize(messages.size() + 1);
            messages.back().sendTime = sendTime;
            messages.back().mess.source = src;
            messages.back().mess.dest = dest;
            messages.back().mess.time = ptime;
            if (messageElement.contains("data")) {
                auto str = messageElement["data"].get<std::string>();
                if (messageElement.contains("encoding")) {
                    if (messageElement["encoding"].get<std::string>() == "base64") {
                        auto offset = hasB64Wrapper(str);
                        if (offset == 0) {
                            messages.back().mess.data =
                                gmlc::utilities::base64_decode_to_string(str);
                            continue;
                        }
                    }
                }
                messages.back().mess.data = decode(std::move(str));
            } else if (messageElement.contains("message")) {
                auto str = messageElement["message"].get<std::string>();
                if (messageElement.contains("encoding")) {
                    if (messageElement["encoding"].get<std::string>() == "base64") {
                        auto offset = hasB64Wrapper(str);
                        if (offset == 0)  // directly encoded no wrapper
                        {
                            messages.back().mess.data =
                                gmlc::utilities::base64_decode_to_string(str);
                            continue;
                        }
                    }
                }
                messages.back().mess.data = decode(std::move(str));
            }
        }
    }
}